

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp3.c
# Opt level: O1

int dooptions(Global *global,fppTag *tags)

{
  SIZES *pSVar1;
  char ***pppcVar2;
  char cVar3;
  char cVar4;
  char **ppcVar5;
  ushort *puVar6;
  char *pcVar7;
  bool bVar8;
  short sVar9;
  DEFBUF *pDVar10;
  ushort **ppuVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  ErrorCode EVar16;
  char *text;
  char *pcVar17;
  byte bVar18;
  bool bVar19;
  SIZES *local_40;
  
  if (tags != (fppTag *)0x0) {
    pppcVar2 = &global->incend;
    bVar8 = false;
    do {
      iVar13 = tags->tag;
      switch(iVar13) {
      case 0:
        bVar8 = true;
        break;
      case 1:
        if (tags->data != (void *)0x0) {
          global->keepcomments = '\x01';
          global->cflag = '\x01';
        }
        break;
      case 2:
        pcVar17 = (char *)tags->data;
        text = pcVar17;
        do {
          pcVar7 = text;
          text = pcVar7 + 1;
          if (*pcVar7 == '\0') {
            text = "1";
            goto LAB_00103fcd;
          }
        } while (*pcVar7 != '=');
        *pcVar7 = '\0';
LAB_00103fcd:
        pDVar10 = defendel(global,pcVar17,0);
        if (pDVar10 == (DEFBUF *)0x0) {
          return 1;
        }
        pcVar17 = savestring(global,text);
        pDVar10->repl = pcVar17;
        pDVar10->nargs = -1;
        break;
      case 3:
        global->eflag = '\x01';
        break;
      case 4:
        ppcVar5 = *pppcVar2;
        if (pppcVar2 <= ppcVar5) {
          iVar13 = 0x11;
          EVar16 = FATAL_TOO_MANY_INCLUDE_DIRS;
LAB_0010407f:
          cerror(global,EVar16);
          return iVar13;
        }
        pcVar17 = (char *)tags->data;
        *pppcVar2 = ppcVar5 + 1;
        *ppcVar5 = pcVar17;
        break;
      case 5:
        bVar18 = tags->data != (void *)0x0;
        goto LAB_00103e31;
      case 6:
        bVar18 = (tags->data != (void *)0x0) * '\x02';
LAB_00103e31:
        global->nflag = global->nflag | bVar18;
        break;
      case 7:
        global->cplusplus = tags->data == (void *)0x0;
        break;
      case 8:
        cVar3 = *tags->data;
        iVar13 = (uint)(cVar3 != '*') << 9;
        pcVar17 = (char *)((long)tags->data + (ulong)(cVar3 == '*'));
        bVar19 = iVar13 == size_table[0].bits;
        if (!bVar19) {
          local_40 = size_table;
          do {
            while( true ) {
              cVar4 = *pcVar17;
              if ((long)cVar4 == 0) {
                if (!bVar19) {
                  EVar16 = WARN_TOO_FEW_VALUES_TO_SIZEOF;
                  goto LAB_0010401d;
                }
                goto LAB_0010400e;
              }
              ppuVar11 = __ctype_b_loc();
              puVar6 = *ppuVar11;
              if ((*(byte *)((long)puVar6 + (long)cVar4 * 2 + 1) & 8) != 0) break;
              pcVar17 = pcVar17 + 1;
              if (bVar19) goto LAB_0010400e;
            }
            lVar14 = (long)*pcVar17;
            sVar9 = 0;
            bVar18 = *(byte *)((long)puVar6 + lVar14 * 2 + 1);
            while ((bVar18 & 8) != 0) {
              sVar9 = (short)(char)lVar14 + sVar9 * 10 + -0x30;
              lVar14 = (long)pcVar17[1];
              pcVar17 = pcVar17 + 1;
              bVar18 = *(byte *)((long)puVar6 + lVar14 * 2 + 1);
            }
            (&local_40->size)[cVar3 == '*'] = sVar9;
            pSVar1 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar19 = iVar13 == pSVar1->bits;
          } while (!bVar19);
        }
LAB_0010400e:
        if (*pcVar17 != '\0') {
          EVar16 = WARN_TOO_MANY_VALUES_TO_SIZEOF;
LAB_0010401d:
          cerror(global,EVar16,0);
        }
        break;
      case 9:
        pDVar10 = defendel(global,(char *)tags->data,1);
        if (pDVar10 == (DEFBUF *)0x0) {
          pvVar15 = tags->data;
          EVar16 = WARN_NOT_DEFINED;
          goto LAB_00103faf;
        }
        break;
      case 10:
        global->wflag = global->wflag + '\x01';
        break;
      case 0xb:
        strcpy(global->work,(char *)tags->data);
        global->first_file = (char *)tags->data;
        break;
      case 0xc:
        global->input = (_func_char_ptr_char_ptr_int_void_ptr *)tags->data;
        break;
      case 0xd:
        global->output = (_func_void_int_void_ptr *)tags->data;
        break;
      case 0xe:
        global->userdata = tags->data;
        break;
      case 0xf:
        global->linelines = tags->data != (void *)0x0;
        break;
      case 0x10:
        global->error = (_func_void_void_ptr_char_ptr___va_list_tag_ptr *)tags->data;
        break;
      case 0x11:
        global->warnillegalcpp = tags->data != (void *)0x0;
        break;
      case 0x12:
        global->outputLINE = tags->data != (void *)0x0;
        break;
      case 0x13:
        global->showversion = tags->data == (void *)0x0;
        break;
      case 0x14:
        global->showincluded = tags->data != (void *)0x0;
        break;
      case 0x15:
        global->showbalance = tags->data != (void *)0x0;
        break;
      case 0x16:
        global->showspace = tags->data != (void *)0x0;
        break;
      case 0x17:
        global->nestcomments = tags->data != (void *)0x0;
        break;
      case 0x18:
        global->warnnestcomments = tags->data != (void *)0x0;
        break;
      case 0x19:
        global->warnnoinclude = tags->data != (void *)0x0;
        break;
      case 0x1a:
        global->outputfile = tags->data != (void *)0x0;
        break;
      case 0x1b:
      case 0x1c:
        uVar12 = (ulong)global->included;
        if (0x13 < uVar12) {
          iVar13 = 0x12;
          EVar16 = FATAL_TOO_MANY_INCLUDE_FILES;
          goto LAB_0010407f;
        }
        global->include[uVar12] = (char *)tags->data;
        global->includeshow[uVar12] = iVar13 == 0x1b;
        global->included = global->included + '\x01';
        break;
      case 0x1d:
        global->rightconcat = tags->data != (void *)0x0;
        break;
      case 0x1e:
        global->initialfunc = (char *)tags->data;
        break;
      case 0x1f:
        pcVar17 = (char *)tags->data;
        iVar13 = global->excluded;
        global->excluded = iVar13 + 1;
        global->excludedinit[iVar13] = pcVar17;
        break;
      case 0x20:
        global->outputfunctions = tags->data != (void *)0x0;
        break;
      case 0x21:
        global->webmode = tags->data != (void *)0x0;
        break;
      default:
        EVar16 = WARN_INTERNAL_ERROR;
        pvVar15 = (void *)0x0;
LAB_00103faf:
        cerror(global,EVar16,pvVar15);
      }
      tags = tags + 1;
    } while (!bVar8);
  }
  return 0;
}

Assistant:

int dooptions(struct Global *global, struct fppTag *tags)
{
  /*
   * dooptions is called to process command line arguments (-Detc).
   * It is called only at cpp startup.
   */
  DEFBUF *dp;
  char end=FALSE; /* end of taglist */

  while(tags && !end) {
    switch(tags->tag) {
    case FPPTAG_END:
      end=TRUE;
      break;
    case FPPTAG_INITFUNC:
      global->initialfunc = (char *) tags->data;
      break;
    case FPPTAG_DISPLAYFUNCTIONS:
      global->outputfunctions = tags->data?1:0;
      break;
    case FPPTAG_RIGHTCONCAT:
      global->rightconcat = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTMAIN:
      global->outputfile = tags->data?1:0;
      break;
    case FPPTAG_NESTED_COMMENTS:
      global->nestcomments = tags->data?1:0;
      break;
    case FPPTAG_WARNMISSINCLUDE:
      global->warnnoinclude = tags->data?1:0;
      break;
    case FPPTAG_WARN_NESTED_COMMENTS:
      global->warnnestcomments =  tags->data?1:0;
      break;
    case FPPTAG_OUTPUTSPACE:
      global->showspace = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTBALANCE:
      global->showbalance = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTINCLUDES:
      global->showincluded = tags->data?1:0;
      break;
    case FPPTAG_IGNOREVERSION:
#ifdef GDLPP
      global->showversion = tags->data?0:1;
#else
      global->showversion = tags->data?1:0;
#endif
      break;
    case FPPTAG_WARNILLEGALCPP:
      global->warnillegalcpp = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTLINE:
      global->outputLINE = tags->data?1:0;
      break;
    case FPPTAG_KEEPCOMMENTS:
      if(tags->data) {
	global->cflag = TRUE;
	global->keepcomments = TRUE;
      }
      break;
    case FPPTAG_DEFINE:
      /*
       * If the option is just "-Dfoo", make it -Dfoo=1
       */
      {
	char *symbol=(char *)tags->data;
	char *text=symbol;
	while (*text != EOS && *text != '=')
	  text++;
	if (*text == EOS)
	  text = "1";
	else
	  *text++ = EOS;
	/*
	 * Now, save the word and its definition.
	 */
	dp = defendel(global, symbol, FALSE);
	if(!dp)
	  return(FPP_OUT_OF_MEMORY);
	dp->repl = savestring(global, text);
	dp->nargs = DEF_NOARGS;
      }
      break;
    case FPPTAG_IGNORE_NONFATAL:
      global->eflag = TRUE;
      break;
    case FPPTAG_INCLUDE_DIR:
      if (global->incend >= &global->incdir[NINCLUDE]) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_DIRS);
	  return(FPP_TOO_MANY_INCLUDE_DIRS);
      }
      *global->incend++ = (char *)tags->data;
      break;
    case FPPTAG_INCLUDE_FILE:
    case FPPTAG_INCLUDE_MACRO_FILE:
      if (global->included >= NINCLUDE) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_FILES);
	  return(FPP_TOO_MANY_INCLUDE_FILES);
      }
      global->include[global->included] = (char *)tags->data;

      global->includeshow[global->included] =
	  (tags->tag == FPPTAG_INCLUDE_FILE);

      global->included++;
      break;
    case FPPTAG_BUILTINS:
      global->nflag|=(tags->data?NFLAG_BUILTIN:0);
      break;
    case FPPTAG_PREDEFINES:
      global->nflag|=(tags->data?NFLAG_PREDEFINE:0);
      break;
    case FPPTAG_IGNORE_CPLUSPLUS:
      global->cplusplus=!tags->data;
      break;
    case FPPTAG_SIZEOF_TABLE:
      {
	SIZES *sizp;	/* For -S		*/
	int size;	/* For -S		*/
	int isdatum;	/* FALSE for -S*	*/
	int endtest;	/* For -S		*/

	char *text=(char *)tags->data;

	sizp = size_table;
	if ( (isdatum = (*text != '*')) ) /* If it's just -S,     */
	  endtest = T_FPTR;	/* Stop here		*/
	else {			/* But if it's -S*      */
	  text++;		/* Step over '*'        */
	  endtest = 0;		/* Stop at end marker	*/
	}
	while (sizp->bits != endtest && *text != EOS) {
	  if (!isdigit(*text)) {    /* Skip to next digit   */
	    text++;
	    continue;
	  }
	  size = 0;		/* Compile the value	*/
	  while (isdigit(*text)) {
	    size *= 10;
	    size += (*text++ - '0');
	  }
	  if (isdatum)
	    sizp->size = size;	/* Datum size		*/
	  else
	    sizp->psize = size; /* Pointer size 	*/
	  sizp++;
	}
	if (sizp->bits != endtest)
	  cwarn(global, WARN_TOO_FEW_VALUES_TO_SIZEOF, NULL);
	else if (*text != EOS)
	  cwarn(global, WARN_TOO_MANY_VALUES_TO_SIZEOF, NULL);
      }
      break;
    case FPPTAG_UNDEFINE:
      if (defendel(global, (char *)tags->data, TRUE) == NULL)
	cwarn(global, WARN_NOT_DEFINED, tags->data);
      break;
    case FPPTAG_OUTPUT_DEFINES:
      global->wflag++;
      break;
    case FPPTAG_INPUT_NAME:
      strcpy(global->work, tags->data);    /* Remember input filename */
      global->first_file=tags->data;
      break;
    case FPPTAG_INPUT:
      global->input=(char *(*)(char *, int, void *))tags->data;
      break;
    case FPPTAG_OUTPUT:
      global->output=(void (*)(int, void *))tags->data;
      break;      
    case FPPTAG_ERROR:
      global->error=(void (*)(void *, char *, va_list))tags->data;
      break;
    case FPPTAG_USERDATA:
      global->userdata=tags->data;
      break;
    case FPPTAG_LINE:
      global->linelines= tags->data?1:0;
      break;
    case FPPTAG_EXCLFUNC:
      global->excludedinit[ global->excluded++ ] = (char *)tags->data;
      break;
    case FPPTAG_WEBMODE:
      global->webmode=(tags->data?1:0);
      break;
    default:
      cwarn(global, WARN_INTERNAL_ERROR, NULL);
      break;
    }
    tags++;
  }
  return(0);
}